

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_aggregate_data.cpp
# Opt level: O1

void __thiscall
duckdb::DistinctAggregateData::DistinctAggregateData
          (DistinctAggregateData *this,DistinctAggregateCollectionInfo *info,GroupingSet *groups,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *group_expressions)

{
  size_type __n;
  GroupedAggregateData *__ptr_00;
  pointer puVar1;
  const_reference pvVar2;
  pointer pEVar3;
  BoundAggregateExpression *pBVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Base_ptr p_Var7;
  pointer pLVar8;
  default_delete<duckdb::GroupedAggregateData> *this_01;
  reference pvVar9;
  pointer this_02;
  type op_p;
  RadixPartitionedHashTable *pRVar10;
  default_delete<duckdb::RadixPartitionedHashTable> *this_03;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_p;
  pointer this_04;
  pointer *__ptr;
  ulong uVar11;
  long lVar12;
  pointer __k;
  vector<duckdb::LogicalType,_true> chunk_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  DistinctAggregateData *local_78;
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
  *local_70;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
  *local_68;
  GroupingSet *local_60;
  DistinctAggregateCollectionInfo *local_58;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_50;
  _Base_ptr local_48;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  pointer local_38;
  
  local_70 = &this->radix_tables;
  local_68 = &this->grouping_sets;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->radix_tables).
  super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouped_aggregate_data).
  super_vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grouping_sets).
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->info = info;
  local_78 = this;
  local_60 = groups;
  ::std::
  vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
  ::resize((vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>_>_>
            *)this,info->table_count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
  ::resize(&local_70->
            super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ,info->table_count);
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize(&local_68->
            super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ,info->table_count);
  __k = (info->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_38 = (info->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (__k != local_38) {
    local_40 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&info->table_map;
    local_48 = &(local_60->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_58 = info;
    local_50 = group_expressions;
    do {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](info->aggregates,*__k);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      pBVar4 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar3->super_BaseExpression)
      ;
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(local_40,__k);
      __n = *pmVar5;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
               ::operator[](local_70,__n);
      if ((pvVar6->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl ==
          (RadixPartitionedHashTable *)0x0) {
        this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   *)vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
                     ::operator[](local_68,__n);
        p_Var7 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var7 != local_48) {
          do {
            ::std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>(this_00,(unsigned_long *)(p_Var7 + 1));
            p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
          } while (p_Var7 != local_48);
        }
        if (local_50 ==
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0x0) {
          lVar12 = 0;
        }
        else {
          lVar12 = (long)(local_50->
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_50->
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
        }
        if ((pBVar4->children).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pBVar4->children).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar11 = 0;
          do {
            local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)(lVar12 + uVar11);
            ::std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>
                      ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)this_00,(unsigned_long *)&local_98);
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)(pBVar4->children).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pBVar4->children).
                                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        pLVar8 = (pointer)operator_new(0xb0);
        switchD_01306cb1::default(pLVar8,0,0xa8);
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = pLVar8;
        this_01 = (default_delete<duckdb::GroupedAggregateData> *)
                  vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                  ::operator[](&local_78->grouped_aggregate_data,__n);
        pLVar8 = local_98.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        __ptr_00 = *(GroupedAggregateData **)this_01;
        *(pointer *)this_01 = pLVar8;
        if (__ptr_00 != (GroupedAggregateData *)0x0) {
          ::std::default_delete<duckdb::GroupedAggregateData>::operator()(this_01,__ptr_00);
        }
        if ((GroupedAggregateData *)
            local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (GroupedAggregateData *)0x0) {
          ::std::default_delete<duckdb::GroupedAggregateData>::operator()
                    ((default_delete<duckdb::GroupedAggregateData> *)&local_98,
                     (GroupedAggregateData *)
                     local_98.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar9 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                 ::operator[](&local_78->grouped_aggregate_data,__n);
        this_02 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                  ::operator->(pvVar9);
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](local_58->aggregates,*__k);
        GroupedAggregateData::InitializeDistinct(this_02,pvVar2,local_50);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                 ::operator[](&local_78->grouped_aggregate_data,__n);
        op_p = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
               ::operator*(pvVar9);
        pRVar10 = (RadixPartitionedHashTable *)operator_new(0x68);
        RadixPartitionedHashTable::RadixPartitionedHashTable(pRVar10,(GroupingSet *)this_00,op_p);
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pRVar10;
        this_03 = (default_delete<duckdb::RadixPartitionedHashTable> *)
                  vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  ::operator[](local_70,__n);
        info = local_58;
        pLVar8 = local_98.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pRVar10 = *(RadixPartitionedHashTable **)this_03;
        *(pointer *)this_03 = pLVar8;
        if (pRVar10 != (RadixPartitionedHashTable *)0x0) {
          ::std::default_delete<duckdb::RadixPartitionedHashTable>::operator()(this_03,pRVar10);
        }
        if ((RadixPartitionedHashTable *)
            local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (RadixPartitionedHashTable *)0x0) {
          ::std::default_delete<duckdb::RadixPartitionedHashTable>::operator()
                    ((default_delete<duckdb::RadixPartitionedHashTable> *)&local_98,
                     (RadixPartitionedHashTable *)
                     local_98.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar1 = (pBVar4->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_04 = (pBVar4->children).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_04 != puVar1;
            this_04 = this_04 + 1) {
          pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_04);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_98,&pEVar3->return_type);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98)
        ;
      }
      __k = __k + 1;
    } while (__k != local_38);
  }
  return;
}

Assistant:

DistinctAggregateData::DistinctAggregateData(const DistinctAggregateCollectionInfo &info, const GroupingSet &groups,
                                             const vector<unique_ptr<Expression>> *group_expressions)
    : info(info) {
	grouped_aggregate_data.resize(info.table_count);
	radix_tables.resize(info.table_count);
	grouping_sets.resize(info.table_count);

	for (auto &i : info.indices) {
		auto &aggregate = info.aggregates[i]->Cast<BoundAggregateExpression>();

		D_ASSERT(info.table_map.count(i));
		idx_t table_idx = info.table_map.at(i);
		if (radix_tables[table_idx] != nullptr) {
			//! This aggregate shares a table with another aggregate, and the table is already initialized
			continue;
		}
		// The grouping set contains the indices of the chunk that correspond to the data vector
		// that will be used to figure out in which bucket the payload should be put
		auto &grouping_set = grouping_sets[table_idx];
		//! Populate the group with the children of the aggregate
		for (auto &group : groups) {
			grouping_set.insert(group);
		}
		idx_t group_by_size = group_expressions ? group_expressions->size() : 0;
		for (idx_t set_idx = 0; set_idx < aggregate.children.size(); set_idx++) {
			grouping_set.insert(set_idx + group_by_size);
		}
		// Create the hashtable for the aggregate
		grouped_aggregate_data[table_idx] = make_uniq<GroupedAggregateData>();
		grouped_aggregate_data[table_idx]->InitializeDistinct(info.aggregates[i], group_expressions);
		radix_tables[table_idx] =
		    make_uniq<RadixPartitionedHashTable>(grouping_set, *grouped_aggregate_data[table_idx]);

		// Fill the chunk_types (only contains the payload of the distinct aggregates)
		vector<LogicalType> chunk_types;
		for (auto &child_p : aggregate.children) {
			chunk_types.push_back(child_p->return_type);
		}
	}
}